

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O0

void luaJIT_profile_stop(lua_State *L)

{
  global_State *pgVar1;
  MRef MVar2;
  uint uVar3;
  lj_profile_timer *in_RDI;
  global_State *unaff_retaddr;
  global_State *g;
  ProfileState *ps;
  lua_State *in_stack_ffffffffffffffe0;
  
  pgVar1 = profile_state.g;
  if ((global_State *)(ulong)(in_RDI->opt).interval_msec == profile_state.g) {
    lj_profile_timer_stop(in_RDI);
    pgVar1->hookmask = pgVar1->hookmask & 0x7f;
    lj_dispatch_update(unaff_retaddr);
    pgVar1[5].strempty.marked = '\0';
    pgVar1[5].strempty.gct = '\0';
    pgVar1[5].strempty.reserved = '\0';
    pgVar1[5].strempty.strflags = '\0';
    lj_trace_flushall(in_stack_ffffffffffffffe0);
    MVar2 = profile_state.sb.b;
    uVar3 = profile_state.sb.e.ptr32 - profile_state.sb.b.ptr32;
    (pgVar1->gc).total = (pgVar1->gc).total - uVar3;
    (pgVar1->gc).freed = (ulong)uVar3 + (pgVar1->gc).freed;
    (*pgVar1->allocf)(pgVar1->allocd,(void *)MVar2.ptr32,(ulong)uVar3,0);
    profile_state.sb.b.ptr32 = 0;
    profile_state.sb.e.ptr32 = 0;
    profile_state.g = (global_State *)0x0;
  }
  return;
}

Assistant:

LUA_API void luaJIT_profile_stop(lua_State *L)
{
  ProfileState *ps = &profile_state;
  global_State *g = ps->g;
  if (G(L) == g) {  /* Only stop profiler if started by this VM. */
    lj_profile_timer_stop(&ps->timer);
    g->hookmask &= ~HOOK_PROFILE;
    lj_dispatch_update(g);
#if LJ_HASJIT
    G2J(g)->prof_mode = 0;
    lj_trace_flushall(L);
#endif
    lj_buf_free(g, &ps->sb);
    setmref(ps->sb.b, NULL);
    setmref(ps->sb.e, NULL);
    ps->g = NULL;
  }
}